

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BasicCommands.c
# Opt level: O2

void test_CmdDisconnect(void)

{
  XcpLight_self.session_status = XcpLight_self.session_status | 2;
  XcpLight_self.protection_status = '\0';
  cmdMsg.length = 1;
  cmdMsg.payload[0] = 0xfe;
  XcpLight_processCommand(&cmdMsg);
  UnityAssertEqualNumber(1,(ulong)(byte)reply_msg.length,(char *)0x0,0x4f,UNITY_DISPLAY_STYLE_UINT8)
  ;
  UnityAssertEqualNumber
            (0xff,(ulong)reply_msg.payload[0],(char *)0x0,0x50,UNITY_DISPLAY_STYLE_UINT8);
  return;
}

Assistant:

void test_CmdDisconnect(void)
{
  SET_SESSION_CONNECTED();
  SET_UNLOCK_ALL_RESOURCES();
  cmdMsg.length     = 1u;
  cmdMsg.payload[0] = XCP_CMD_DISCONNECT; // DISCONNECT

  XcpLight_processCommand(&cmdMsg);

  TEST_ASSERT_EQUAL_UINT8(   1u, reply_msg.length);
  TEST_ASSERT_EQUAL_UINT8(0xFFu, reply_msg.payload[0]); // Ok:DISCONNECT
}